

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coverage.cpp
# Opt level: O3

void __thiscall
Coverage_analyserExternalVariable_Test::~Coverage_analyserExternalVariable_Test
          (Coverage_analyserExternalVariable_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Coverage, analyserExternalVariable)
{
    auto externalVariable = libcellml::AnalyserExternalVariable::create(nullptr);

    EXPECT_EQ(nullptr, externalVariable->variable());
    EXPECT_EQ(false, externalVariable->addDependency(nullptr));

    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));
    auto other_model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    externalVariable = libcellml::AnalyserExternalVariable::create(model->component("membrane")->variable("V"));

    externalVariable->addDependency(model->component("membrane")->variable("Cm"));

    EXPECT_EQ(false, externalVariable->removeDependency(nullptr, "membrane", "Cm"));
    EXPECT_EQ(false, externalVariable->removeDependency(model, "not_membrane", "Cm"));
}